

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

string * CLI::detail::remove_outer(string *str,char key)

{
  char *pcVar1;
  __const_iterator __first;
  
  if (((1 < str->_M_string_length) && (pcVar1 = (str->_M_dataplus)._M_p, *pcVar1 == key)) &&
     (pcVar1[str->_M_string_length - 1] == key)) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back(str);
    __first._M_current = (str->_M_dataplus)._M_p;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              (str,__first,(__const_iterator)(__first._M_current + 1));
  }
  return str;
}

Assistant:

CLI11_INLINE std::string &remove_outer(std::string &str, char key) {
    if(str.length() > 1 && (str.front() == key)) {
        if(str.front() == str.back()) {
            str.pop_back();
            str.erase(str.begin(), str.begin() + 1);
        }
    }
    return str;
}